

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O0

void __thiscall
Js::ProbeContainer::DispatchInlineBreakpoint(ProbeContainer *this,InterpreterHaltState *pHaltState)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  anon_class_8_1_8991fb9c local_30;
  anon_class_16_2_8f409ebb local_28;
  InterpreterHaltState *local_18;
  InterpreterHaltState *pHaltState_local;
  ProbeContainer *this_local;
  
  local_18 = pHaltState;
  pHaltState_local = (InterpreterHaltState *)this;
  Output::Trace(DebuggerPhase,
                L"ProbeContainer::DispatchInlineBreakpoint: start: this=%p, pHaltState=%p\n",this,
                pHaltState);
  bVar2 = CanDispatchHalt(this,local_18);
  if (bVar2) {
    if (local_18->stopType != STOP_INLINEBREAKPOINT) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                  ,0x164,"(pHaltState->stopType == STOP_INLINEBREAKPOINT)",
                                  "pHaltState->stopType == STOP_INLINEBREAKPOINT");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    local_28.pHaltState = &local_18;
    local_30.this = this;
    local_28.this = this;
    TryFinally<Js::ProbeContainer::DispatchInlineBreakpoint(Js::InterpreterHaltState*)::__0,Js::ProbeContainer::DispatchInlineBreakpoint(Js::InterpreterHaltState*)::__1>
              (&local_28,&local_30);
    Output::Trace(DebuggerPhase,L"ProbeContainer::DispatchInlineBreakpoint: end: pHaltState=%p\n",
                  local_18);
  }
  return;
}

Assistant:

void ProbeContainer::DispatchInlineBreakpoint(InterpreterHaltState* pHaltState)
    {
        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchInlineBreakpoint: start: this=%p, pHaltState=%p\n"), this, pHaltState);

        if (!CanDispatchHalt(pHaltState))
        {
            return;
        }

        Assert(pHaltState->stopType == STOP_INLINEBREAKPOINT);

        TryFinally([&]()
        {
            InitializeLocation(pHaltState);
            OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchInlineBreakpoint: initialized location: pHaltState=%p, pHaltState->IsValid()=%d\n"),
                pHaltState, pHaltState->IsValid());

            Assert(pHaltState->IsValid());

            // The ByteCodeReader should be available at this point, but because of possibility of garbled frame, we shouldn't hit AV
            if (pHaltState->IsValid())
            {
#if DBG
                pHaltState->GetFunction()->MustBeInDebugMode();
#endif

                // an inline breakpoint is being dispatched deactivate other stopping controllers
                debugManager->stepController.Deactivate(pHaltState);
                debugManager->asyncBreakController.Deactivate();

                pHaltState->GetFunction()->CheckAndRegisterFuncToDiag(pScriptContext);

                haltCallbackProbe->DispatchHalt(pHaltState);
            }
        },
        [&](bool)
        {
            DestroyLocation();
        });

        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchInlineBreakpoint: end: pHaltState=%p\n"), pHaltState);
    }